

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

void __thiscall TypeInfo::inform_type(TypeInfo *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  GoalType typ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined4 uStack_84;
  long *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  TypeSpec local_60;
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,name);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_80 = (long *)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + name->_M_string_length);
    if (local_80 == (long *)&local_70) {
      uStack_90 = uStack_68;
      local_a8 = &local_98;
    }
    else {
      local_a8 = local_80;
    }
    local_98 = CONCAT71(uStack_6f,local_70);
    local_a0 = local_78;
    local_78 = 0;
    local_70 = 0;
    local_88 = 0;
    uStack_84 = 0xffffffff;
    local_80 = (long *)&local_70;
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,name);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar4->m_has_info = (bool)(char)local_88;
    pmVar4->m_method_count_set = (bool)(char)((ushort)local_88 >> 8);
    *(undefined2 *)&pmVar4->field_0x22 = uStack_86;
    pmVar4->m_method_count = uStack_84;
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
  }
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"type","");
  paVar1 = &local_60.m_base_type.field_2;
  if (local_c8 == &local_b8) {
    local_60.m_base_type.field_2._8_8_ = local_b8._8_8_;
    local_60.m_base_type._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.m_base_type._M_dataplus._M_p = (pointer)local_c8;
  }
  local_60.m_base_type.field_2._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
  local_60.m_base_type.field_2._M_local_buf[0] = local_b8._M_local_buf[0];
  local_60.m_base_type._M_string_length = local_c0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_60.m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = &local_b8;
  inform_symbol(this,name,&local_60);
  std::vector<TypeSpec,_std::allocator<TypeSpec>_>::~vector(&local_60.m_args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_base_type._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.m_base_type._M_dataplus._M_p,
                    local_60.m_base_type.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void TypeInfo::inform_type(const std::string& name) {
  if (m_types.find(name) == m_types.end()) {
    GoalType typ(name);
    m_types[name] = typ;
  }
  inform_symbol(name, TypeSpec("type"));
}